

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndTag
               (void *context,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  bool bVar1;
  pointer pXVar2;
  char *pcVar3;
  element_type *peVar4;
  string message;
  shared_ptr<iDynTree::XMLElement> element;
  XMLParser *state;
  shared_ptr<iDynTree::XMLElement> *in_stack_fffffffffffffe78;
  shared_ptr<iDynTree::XMLElement> *in_stack_fffffffffffffe80;
  shared_ptr<iDynTree::XMLElement> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffec0;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [55];
  undefined1 local_79 [33];
  string local_58 [88];
  
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1281c4);
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  ::top((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
         *)0x1281d3);
  std::shared_ptr<iDynTree::XMLElement>::shared_ptr
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pXVar2 = std::
           unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
           ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                         *)0x1281f0);
  if ((pXVar2->m_logParsing & 1U) != 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0._M_pi,(char *)in_stack_fffffffffffffeb8,
               (allocator<char> *)__rhs);
    std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x128237);
    XMLElement::getParsedTextContent_abi_cxx11_((XMLElement *)in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffeb8,__rhs);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportInfo("XMLParser","parserCallbackEndTag",pcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffec0._M_pi,(char *)in_stack_fffffffffffffeb8,
               (allocator<char> *)__rhs);
    std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1282e8);
    XMLElement::name_abi_cxx11_((XMLElement *)in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffeb8,__rhs);
    std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
    std::__cxx11::string::operator=(local_58,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportInfo("XMLParser","parserCallbackEndTag",pcVar3);
    std::__cxx11::string::~string(local_58);
  }
  peVar4 = std::__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1284db);
  (*peVar4->_vptr_XMLElement[3])();
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x1284f6);
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  ::pop((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
         *)0x128505);
  std::
  unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
  ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                *)0x128514);
  bVar1 = std::
          stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
          ::empty((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
                   *)0x128523);
  if (!bVar1) {
    std::
    unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
    ::operator->((unique_ptr<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                  *)0x128544);
    std::
    stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
    ::top((stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
           *)0x128553);
    peVar4 = std::
             __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x128564);
    this = (shared_ptr<iDynTree::XMLElement> *)&stack0xfffffffffffffeb8;
    std::shared_ptr<iDynTree::XMLElement>::shared_ptr
              (this,(shared_ptr<iDynTree::XMLElement> *)peVar4);
    (*peVar4->_vptr_XMLElement[4])(peVar4,this);
    std::shared_ptr<iDynTree::XMLElement>::~shared_ptr((shared_ptr<iDynTree::XMLElement> *)0x12859d)
    ;
  }
  std::shared_ptr<iDynTree::XMLElement>::~shared_ptr((shared_ptr<iDynTree::XMLElement> *)0x1285e2);
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndTag(void* context,
                                                         const xmlChar * localname,
                                                         const xmlChar * prefix,
                                                         const xmlChar * URI)
    {
        // TODO: use the prefix and uri, or remove them from the parameters        
        XMLParser *state = static_cast<XMLParser*>(context);
        std::shared_ptr<XMLElement> element = state->m_pimpl->m_parsedTrace.top();

        if (state->m_pimpl->m_logParsing) {
            // Add here the optional text content
            std::string message = std::string("Content of tag: ") + element->getParsedTextContent();
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
            
            // TODO: reportXXX should either accept a format + var arguments or something else
            message = std::string("End of tag <") + element->name() + (">");
            reportInfo("XMLParser", "parserCallbackEndTag", message.c_str());
        }
        element->exitElementScope();
        state->m_pimpl->m_parsedTrace.pop();
        // Get a callback also to the parent, if any
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            state->m_pimpl->m_parsedTrace.top()->childHasBeenParsed(element);
        }
    }